

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O0

void __thiscall
burst::difference_iterator<const_int_*,_const_int_*,_std::less<void>_>::drop_subtrahend_head
          (difference_iterator<const_int_*,_const_int_*,_std::less<void>_> *this)

{
  bool bVar1;
  int *piVar2;
  undefined1 local_20 [8];
  iterator_range<const_int_*> subtrahend;
  difference_iterator<const_int_*,_const_int_*,_std::less<void>_> *this_local;
  
  if (((this->m_minuend_begin != this->m_minuend_end) &&
      (this->m_subtrahend_begin != this->m_subtrahend_end)) &&
     (subtrahend.
      super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           (int *)this,
     bVar1 = (((std::forward<int_const&>)({parm#1}))<((std::forward<int_const&>)({parm#2})))std::
             less<void>::operator()
                       (&this->field_0x20,this->m_subtrahend_begin,this->m_minuend_begin), bVar1)) {
    _local_20 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>)
                boost::make_iterator_range<int_const*>
                          (this->m_subtrahend_begin,this->m_subtrahend_end);
    skip_to_lower_bound<boost::iterator_range<int_const*>,int,std::less<void>>
              (local_20,this->m_minuend_begin);
    piVar2 = boost::iterator_range_detail::
             iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::begin
                       ((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                         *)local_20);
    this->m_subtrahend_begin = piVar2;
  }
  return;
}

Assistant:

void drop_subtrahend_head ()
        {
            if (m_minuend_begin != m_minuend_end
                && m_subtrahend_begin != m_subtrahend_end
                && m_compare(*m_subtrahend_begin, *m_minuend_begin))
            {
                auto subtrahend = boost::make_iterator_range(m_subtrahend_begin, m_subtrahend_end);
                skip_to_lower_bound(subtrahend, *m_minuend_begin, m_compare);
                m_subtrahend_begin = subtrahend.begin();
            }
        }